

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char>::iterate
          (TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *this)

{
  code *pcVar1;
  bool bVar2;
  uchar expectedBorderColor;
  bool bVar3;
  unsigned_short uVar4;
  int iVar5;
  deUint32 dVar6;
  GLint GVar7;
  GLenum GVar8;
  undefined4 uVar9;
  GLuint GVar10;
  GLuint GVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  TestError *pTVar14;
  TestConfiguration<unsigned_short,_unsigned_char> *this_00;
  uchar local_8d;
  GLint GStack_88;
  uchar expectedColor;
  GLint layerLocation;
  GLint i;
  uint local_78;
  uint local_74;
  GLint border_color_2 [4];
  uint local_58;
  GLint val_2;
  GLuint border_color_1 [4];
  float local_38;
  GLuint val_1;
  GLfloat border_color [4];
  GLfloat val;
  GLint samplerLocation;
  bool testResult;
  Functions *gl;
  TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *this_local;
  long lVar13;
  
  initTest(this);
  pRVar12 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar5 = (*pRVar12->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar5);
  bVar2 = true;
  (**(code **)(lVar13 + 0x1680))(this->m_po_id);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Error using program!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x192);
  (**(code **)(lVar13 + 0x40))(0x8892,this->m_position_vbo_id);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x196);
  GVar7 = (**(code **)(lVar13 + 0x780))(this->m_po_id,"vertex_position_in");
  this->m_attr_position_location = GVar7;
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x199);
  (**(code **)(lVar13 + 0x19f0))(this->m_attr_position_location,4,0x1406,0);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Could not set vertex attribute pointer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x19c);
  (**(code **)(lVar13 + 0x610))(this->m_attr_position_location);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Could not enable vertex attribute array!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x19f);
  (**(code **)(lVar13 + 0x40))(0x8892,this->m_text_coord_vbo_id);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1a3);
  GVar7 = (**(code **)(lVar13 + 0x780))(this->m_po_id,"texture_coords_in");
  this->m_attr_texcoord_location = GVar7;
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1a6);
  (**(code **)(lVar13 + 0x19f0))(this->m_attr_texcoord_location,2,0x1406,0,0,0);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Could not set vertex attribute pointer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1a9);
  (**(code **)(lVar13 + 0x610))(this->m_attr_texcoord_location);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Could not enable vertex attribute array!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1ac);
  (**(code **)(lVar13 + 8))(0x84c0);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Error setting active texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b0);
  pcVar1 = *(code **)(lVar13 + 0xb8);
  GVar8 = TestConfiguration<unsigned_short,_unsigned_char>::get_target(&this->m_test_configuration);
  (*pcVar1)(GVar8,this->m_input_to_id);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Error binding texture!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b3);
  uVar9 = (**(code **)(lVar13 + 0xb48))(this->m_po_id,"test_sampler");
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Erros getting sampler location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b6);
  (**(code **)(lVar13 + 0x14f0))(uVar9,0);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Could not bind sampler location to texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b9);
  (**(code **)(lVar13 + 0xa8))(0,this->m_sampler_id);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Could not bind sampler object to texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1bc);
  GVar8 = TestConfiguration<unsigned_short,_unsigned_char>::get_input_internal_format
                    (&this->m_test_configuration);
  if ((GVar8 != 0x8058) && (GVar8 != 0x81a5)) {
    if (GVar8 == 0x8235) {
      uVar4 = TestConfiguration<unsigned_short,_unsigned_char>::get_init_border_color
                        (&this->m_test_configuration);
      local_78 = (uint)uVar4;
      local_74 = local_78;
      border_color_2[0] = local_78;
      border_color_2[1] = local_78;
      (**(code **)(lVar13 + 0x1260))
                (this->m_sampler_id,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR,
                 &local_78);
      goto LAB_01569dfd;
    }
    if (GVar8 == 0x8236) {
      uVar4 = TestConfiguration<unsigned_short,_unsigned_char>::get_init_border_color
                        (&this->m_test_configuration);
      local_58 = (uint)uVar4;
      val_2 = local_58;
      border_color_1[0] = local_58;
      border_color_1[1] = local_58;
      (**(code **)(lVar13 + 0x1268))
                (this->m_sampler_id,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR,
                 &local_58);
      goto LAB_01569dfd;
    }
    if (((GVar8 != 0x8814) && (GVar8 != 0x8cac)) && (GVar8 != 0x9278)) {
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,"Unsupported sized internal format. Should never happen!","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x1dc);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  uVar4 = TestConfiguration<unsigned_short,_unsigned_char>::get_init_border_color
                    (&this->m_test_configuration);
  local_38 = (float)uVar4;
  val_1 = (GLuint)local_38;
  border_color[0] = local_38;
  border_color[1] = local_38;
  border_color[3] = local_38;
  (**(code **)(lVar13 + 0x1278))
            (this->m_sampler_id,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR,
             &local_38);
LAB_01569dfd:
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Error setting border color parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1df);
  (**(code **)(lVar13 + 0x1280))
            (this->m_sampler_id,0x2802,(this->super_TestCaseBase).m_glExtTokens.CLAMP_TO_BORDER);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Error setting GL_TEXTURE_WRAP_S parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1e3);
  (**(code **)(lVar13 + 0x1280))
            (this->m_sampler_id,0x8072,(this->super_TestCaseBase).m_glExtTokens.CLAMP_TO_BORDER);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Error setting GL_TEXTURE_WRAP_R parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1e5);
  (**(code **)(lVar13 + 0x1280))
            (this->m_sampler_id,0x2803,(this->super_TestCaseBase).m_glExtTokens.CLAMP_TO_BORDER);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Error setting GL_TEXTURE_WRAP_T parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1e7);
  pcVar1 = *(code **)(lVar13 + 0x1280);
  GVar10 = this->m_sampler_id;
  GVar8 = TestConfiguration<unsigned_short,_unsigned_char>::get_filtering
                    (&this->m_test_configuration);
  (*pcVar1)(GVar10,0x2800,GVar8);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Error setting value for GL_TEXTURE_MAG_FILTER parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1eb);
  pcVar1 = *(code **)(lVar13 + 0x1280);
  GVar10 = this->m_sampler_id;
  GVar8 = TestConfiguration<unsigned_short,_unsigned_char>::get_filtering
                    (&this->m_test_configuration);
  (*pcVar1)(GVar10,0x2801,GVar8);
  dVar6 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar6,"Error setting value for GL_TEXTURE_MIN_FILTER parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1ed);
  GStack_88 = getStartingLayerIndex(this);
  do {
    GVar7 = getLastLayerIndex(this);
    if (GVar7 <= GStack_88) {
      if (bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      return STOP;
    }
    uVar9 = (**(code **)(lVar13 + 0xb48))(this->m_po_id,"layer");
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error getting layer uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,499);
    pcVar1 = *(code **)(lVar13 + 0x14e0);
    getCoordinateValue(this,GStack_88);
    (*pcVar1)(uVar9);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error setting layer uniform variable!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x1f6);
    (**(code **)(lVar13 + 0x78))(0x8ca9,this->m_fbo_id);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error binding framebuffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x1fa);
    pcVar1 = *(code **)(lVar13 + 0x1a00);
    this_00 = &this->m_test_configuration;
    GVar10 = TestConfiguration<unsigned_short,_unsigned_char>::get_width(this_00);
    GVar11 = TestConfiguration<unsigned_short,_unsigned_char>::get_height(this_00);
    (*pcVar1)(0,0,GVar10,GVar11);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error setting view port!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x201);
    (**(code **)(lVar13 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_output_to_id,0);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Could not attach texture object to GL_COLOR_ATTACHMENT0!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x209);
    checkFramebufferStatus(this,0x8ca9);
    (**(code **)(lVar13 + 0x188))(0x4000);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error clearing color buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x210);
    (**(code **)(lVar13 + 0x538))(5,0,4);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Rendering failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x214);
    GVar8 = TestConfiguration<unsigned_short,_unsigned_char>::get_target(this_00);
    if (GVar8 == 0xde1) {
LAB_0156a2ad:
      local_8d = TestConfiguration<unsigned_short,_unsigned_char>::get_expected_value
                           (&this->m_test_configuration);
    }
    else {
      if (GVar8 != 0x806f) {
        if (GVar8 != 0x8c1a) {
          pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar14,
                     "Not allowed texture target - should be one of GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                     ,0x22a);
          __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        goto LAB_0156a2ad;
      }
      if ((GStack_88 < 0) ||
         (GVar10 = TestConfiguration<unsigned_short,_unsigned_char>::get_depth
                             (&this->m_test_configuration), (int)GVar10 <= GStack_88)) {
        local_8d = TestConfiguration<unsigned_short,_unsigned_char>::get_expected_border_color
                             (&this->m_test_configuration);
      }
      else {
        local_8d = TestConfiguration<unsigned_short,_unsigned_char>::get_expected_value
                             (&this->m_test_configuration);
      }
    }
    expectedBorderColor =
         TestConfiguration<unsigned_short,_unsigned_char>::get_expected_border_color
                   (&this->m_test_configuration);
    bVar3 = checkResult(this,local_8d,expectedBorderColor,GStack_88);
    if (!bVar3) {
      bVar2 = false;
    }
    GStack_88 = GStack_88 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureBorderClampSamplingTexture<InputType, OutputType>::iterate(void)
{
	/* Initialize test case */
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool testResult = true;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error using program!");

	/* Configure vertices position attribute */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_position_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	m_attr_position_location = gl.getAttribLocation(m_po_id, "vertex_position_in");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");

	gl.vertexAttribPointer(m_attr_position_location, 4, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set vertex attribute pointer!");

	gl.enableVertexAttribArray(m_attr_position_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array!");

	/* Configure texture coordinates attribute */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_text_coord_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	m_attr_texcoord_location = gl.getAttribLocation(m_po_id, "texture_coords_in");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");

	gl.vertexAttribPointer(m_attr_texcoord_location, 2, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set vertex attribute pointer!");

	gl.enableVertexAttribArray(m_attr_texcoord_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array!");

	/* Configure and bind sampler to texture unit */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active texture unit!");

	gl.bindTexture(m_test_configuration.get_target(), m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture!");

	glw::GLint samplerLocation = gl.getUniformLocation(m_po_id, "test_sampler");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Erros getting sampler location!");

	gl.uniform1i(samplerLocation, m_texture_unit);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind sampler location to texture unit!");

	gl.bindSampler(m_texture_unit, m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind sampler object to texture unit!");

	/* Set GL_TEXTURE_BORDER_COLOR_EXT for sampler object */
	switch (m_test_configuration.get_input_internal_format())
	{
	case GL_RGBA32F:
	case GL_RGBA8:
	case GL_DEPTH_COMPONENT32F:
	case GL_DEPTH_COMPONENT16:
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
	{
		glw::GLfloat val			= (glw::GLfloat)m_test_configuration.get_init_border_color();
		glw::GLfloat border_color[] = { val, val, val, val };
		gl.samplerParameterfv(m_sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, border_color);
		break;
	}
	case GL_R32UI:
	{
		glw::GLuint val			   = (glw::GLuint)m_test_configuration.get_init_border_color();
		glw::GLuint border_color[] = { val, val, val, val };
		gl.samplerParameterIuiv(m_sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, border_color);
		break;
	}
	case GL_R32I:
	{
		glw::GLint val			  = (glw::GLint)m_test_configuration.get_init_border_color();
		glw::GLint border_color[] = { val, val, val, val };
		gl.samplerParameterIiv(m_sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, border_color);
		break;
	}

	default:
		throw tcu::TestError("Unsupported sized internal format. Should never happen!", "", __FILE__, __LINE__);
		break;
	};
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting border color parameter!");

	/* Set sampler's GL_TEXTURE_WRAP_* parameters values to GL_CLAMP_TO_BORDER_EXT */
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_WRAP_S, m_glExtTokens.CLAMP_TO_BORDER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_TEXTURE_WRAP_S parameter!");
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_WRAP_R, m_glExtTokens.CLAMP_TO_BORDER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_TEXTURE_WRAP_R parameter!");
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_WRAP_T, m_glExtTokens.CLAMP_TO_BORDER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_TEXTURE_WRAP_T parameter!");

	/* Set GL_TEXTURE_MAG_FILTER and GL_TEXTURE_MIN_FILTER parameters values */
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_MAG_FILTER, m_test_configuration.get_filtering());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for GL_TEXTURE_MAG_FILTER parameter!");
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_MIN_FILTER, m_test_configuration.get_filtering());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for GL_TEXTURE_MIN_FILTER parameter!");

	for (glw::GLint i = getStartingLayerIndex(); i < getLastLayerIndex(); ++i)
	{
		/* Configure layer (third texture coordinate) */
		glw::GLint layerLocation = gl.getUniformLocation(m_po_id, "layer");
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting layer uniform location!");

		gl.uniform1f(layerLocation, getCoordinateValue(i));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting layer uniform variable!");

		/* Bind framebuffer object */
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding framebuffer object!");

		/* Set view port */
		gl.viewport(0,									/* x */
					0,									/* y */
					m_test_configuration.get_width(),   /* width */
					m_test_configuration.get_height()); /* height */
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting view port!");

		/* Attach texture to framebuffer */
		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER,  /* target */
								GL_COLOR_ATTACHMENT0, /* attachment */
								GL_TEXTURE_2D,		  /* textarget */
								m_output_to_id,		  /* texture */
								0);					  /* level */
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach texture object to GL_COLOR_ATTACHMENT0!");

		/* Check framebuffer status */
		checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

		/* Clear the color buffer with (0.5, 0.5, 0.5, 1) color */
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error clearing color buffer");

		/* Render */
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

		/* Get data from framebuffer's color attachment and compare with expected values.
		 * For GL_NEAREST filtering and GL_TEXTURE_3D texture target and Layer equal to
		 * -1 or Depth the whole texture is expected to be filled with border color
		 */
		OutputType expectedColor;

		switch (m_test_configuration.get_target())
		{
		case GL_TEXTURE_2D:
		case GL_TEXTURE_2D_ARRAY:
			expectedColor = m_test_configuration.get_expected_value();
			break;

		case GL_TEXTURE_3D:
			if (i > -1 && i < (glw::GLint)m_test_configuration.get_depth())
				expectedColor = m_test_configuration.get_expected_value();
			else
				expectedColor = m_test_configuration.get_expected_border_color();
			break;
		default:
			TCU_FAIL("Not allowed texture target - should be one of GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D");
		}

		if (!checkResult(expectedColor, m_test_configuration.get_expected_border_color(), i))
		{
			testResult = false;
		}
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	return STOP;
}